

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

bool __thiscall
duckdb::ART::Construct
          (ART *this,unsafe_vector<ARTKey> *keys,unsafe_vector<ARTKey> *row_ids,idx_t row_count)

{
  bool bVar1;
  ARTKeySection section;
  ARTKeySection local_40;
  
  ARTKeySection::ARTKeySection(&local_40,0,row_count - 1,0,'\0');
  bVar1 = ConstructInternal(this,keys,row_ids,&this->tree,&local_40);
  return bVar1;
}

Assistant:

bool ART::Construct(unsafe_vector<ARTKey> &keys, unsafe_vector<ARTKey> &row_ids, const idx_t row_count) {
	ARTKeySection section(0, row_count - 1, 0, 0);
	if (!ConstructInternal(keys, row_ids, tree, section)) {
		return false;
	}

#ifdef DEBUG
	unsafe_vector<row_t> row_ids_debug;
	Iterator it(*this);
	it.FindMinimum(tree);
	ARTKey empty_key = ARTKey();
	it.Scan(empty_key, NumericLimits<row_t>().Maximum(), row_ids_debug, false);
	D_ASSERT(row_count == row_ids_debug.size());
#endif
	return true;
}